

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O0

void __thiscall Balk::add_moment(Balk *this,int shift,double segment_length,double value)

{
  shared_ptr<Moment> local_48;
  shared_ptr<Term> local_38;
  double local_28;
  double value_local;
  double segment_length_local;
  Balk *pBStack_10;
  int shift_local;
  Balk *this_local;
  
  local_28 = value;
  value_local = segment_length;
  segment_length_local._4_4_ = shift;
  pBStack_10 = this;
  std::make_shared<Moment,int&,double&,double&>
            ((int *)&local_48,(double *)((long)&segment_length_local + 4),&value_local);
  std::shared_ptr<Term>::shared_ptr<Moment,void>(&local_38,&local_48);
  std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::push_back
            (&this->terms,&local_38);
  std::shared_ptr<Term>::~shared_ptr(&local_38);
  std::shared_ptr<Moment>::~shared_ptr(&local_48);
  return;
}

Assistant:

void Balk::add_moment(int shift, double segment_length, double value)
{
    terms.push_back(std::make_shared<Moment>(shift, segment_length, value));
}